

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

void __thiscall ncnn::ParamDict::ParamDict(ParamDict *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0x28;
  do {
    puVar1 = (undefined8 *)((long)this->params + lVar2 + -0x14);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->params + lVar2 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&this->params[0].type + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&this->params[0].v.refcount + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x48;
  } while (lVar2 != 0x928);
  clear(this);
  return;
}

Assistant:

ParamDict::ParamDict()
{
    clear();
}